

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::setMaximizeMode(QMdiSubWindowPrivate *this)

{
  long lVar1;
  Representation RVar2;
  bool bVar3;
  bool bVar4;
  QWidget *this_00;
  QRect *pQVar5;
  QMenuBar *pQVar6;
  QWidget *pQVar7;
  QAbstractScrollArea *pQVar8;
  QWidget *pQVar9;
  QScrollBar *pQVar10;
  QScrollBar *pQVar11;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int yOffset;
  int xOffset;
  QScrollBar *vbar;
  QScrollBar *hbar;
  QAbstractScrollArea *scrollArea;
  QWidget *parent;
  QMenuBar *mBar;
  bool wasVisible;
  QMdiSubWindow *q;
  QRect availableRect;
  undefined4 in_stack_ffffffffffffff68;
  undefined1 enable;
  WindowStateAction in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 uVar12;
  int in_stack_ffffffffffffff74;
  uint uVar13;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff80;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff88;
  QSize *in_stack_ffffffffffffff90;
  WindowState state;
  QMdiSubWindowPrivate *mdiChild;
  ControlContainer *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mdiChild = in_RDI;
  this_00 = &q_func(in_RDI)->super_QWidget;
  ensureWindowState(in_RDI,(WindowState)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  in_RDI->isShadeMode = false;
  in_RDI->isMaximizeMode = true;
  storeFocusWidget((QMdiSubWindowPrivate *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  setSizeGripVisible(in_stack_ffffffffffffff80,SUB41((uint)in_stack_ffffffffffffff7c >> 0x18,0));
  bVar3 = QSize::isValid((QSize *)in_stack_ffffffffffffff80);
  if (!bVar3) {
    pQVar5 = QWidget::geometry(this_00);
    RVar2.m_i = (pQVar5->y1).m_i;
    (in_RDI->oldGeometry).x1 = (Representation)(pQVar5->x1).m_i;
    (in_RDI->oldGeometry).y1 = (Representation)RVar2.m_i;
    RVar2.m_i = (pQVar5->y2).m_i;
    (in_RDI->oldGeometry).x2 = (Representation)(pQVar5->x2).m_i;
    (in_RDI->oldGeometry).y2 = (Representation)RVar2.m_i;
    in_stack_ffffffffffffff88 = (QMdiSubWindowPrivate *)&in_RDI->restoreSize;
    QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QSize::setWidth((QSize *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffff90 = &in_RDI->restoreSize;
    QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QSize::setHeight((QSize *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
  }
  bVar3 = QWidget::isVisible((QWidget *)0x63132c);
  if (bVar3) {
    (**(code **)(*(long *)this_00 + 0x68))(this_00,0);
  }
  bVar4 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x631357);
  if ((bVar4) && ((in_RDI->isWidgetHiddenByUs & 1U) != 0)) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x63137c);
    QWidget::show((QWidget *)in_stack_ffffffffffffff80);
    in_RDI->isWidgetHiddenByUs = false;
  }
  updateGeometryConstraints(in_stack_ffffffffffffff88);
  if (bVar3) {
    pQVar6 = menuBar((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (pQVar6 == (QMenuBar *)0x0) {
      bVar4 = ::QPointer::operator_cast_to_bool((QPointer<QMdi::ControlContainer> *)0x6313da);
      if (!bVar4) {
        in_stack_ffffffffffffff80 = (QMdiSubWindowPrivate *)operator_new(0x70);
        QMdi::ControlContainer::ControlContainer
                  (in_stack_ffffffffffffffe8,(QMdiSubWindow *)mdiChild);
        QPointer<QMdi::ControlContainer>::operator=
                  ((QPointer<QMdi::ControlContainer> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (ControlContainer *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                  );
      }
    }
    else {
      showButtonsInMenuBar(in_RDI,(QMenuBar *)in_stack_ffffffffffffff90);
    }
  }
  state = (WindowState)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  enable = (undefined1)((uint)in_stack_ffffffffffffff68 >> 0x18);
  pQVar7 = QWidget::parentWidget((QWidget *)0x63141e);
  QWidget::contentsRect((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QWidget::parentWidget((QWidget *)0x631465);
  pQVar8 = qobject_cast<QAbstractScrollArea*>((QObject *)0x63146d);
  if ((pQVar8 != (QAbstractScrollArea *)0x0) &&
     (pQVar9 = QAbstractScrollArea::viewport
                         ((QAbstractScrollArea *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
     pQVar9 == pQVar7)) {
    pQVar10 = QAbstractScrollArea::horizontalScrollBar
                        ((QAbstractScrollArea *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    pQVar11 = QAbstractScrollArea::verticalScrollBar
                        ((QAbstractScrollArea *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (pQVar10 == (QScrollBar *)0x0) {
      in_stack_ffffffffffffff7c = 0;
    }
    else {
      in_stack_ffffffffffffff7c =
           QAbstractSlider::value
                     ((QAbstractSlider *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    if (pQVar11 == (QScrollBar *)0x0) {
      in_stack_ffffffffffffff78 = 0;
    }
    else {
      in_stack_ffffffffffffff78 =
           QAbstractSlider::value
                     ((QAbstractSlider *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    QRect::adjust((QRect *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                  in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
    QRect::adjust((QRect *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                  in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  }
  setNewGeometry(in_stack_ffffffffffffff88,(QRect *)in_stack_ffffffffffffff80);
  ensureWindowState(in_RDI,state);
  if (bVar3) {
    (**(code **)(*(long *)this_00 + 0x68))(this_00,1);
  }
  in_RDI->resizeEnabled = false;
  in_RDI->moveEnabled = false;
  uVar13 = 1;
  setEnabled((QMdiSubWindowPrivate *)CONCAT44(1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,(bool)enable);
  uVar12 = 0;
  setEnabled((QMdiSubWindowPrivate *)((ulong)uVar13 << 0x20),in_stack_ffffffffffffff6c,(bool)enable)
  ;
  setEnabled((QMdiSubWindowPrivate *)CONCAT44(uVar13,uVar12),in_stack_ffffffffffffff6c,(bool)enable)
  ;
  setEnabled((QMdiSubWindowPrivate *)CONCAT44(uVar13,uVar12),in_stack_ffffffffffffff6c,(bool)enable)
  ;
  setEnabled((QMdiSubWindowPrivate *)CONCAT44(uVar13,uVar12),in_stack_ffffffffffffff6c,(bool)enable)
  ;
  restoreFocus((QMdiSubWindowPrivate *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
              );
  updateMask(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setMaximizeMode()
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(parent);

    ensureWindowState(Qt::WindowMaximized);
    isShadeMode = false;
    isMaximizeMode = true;

    storeFocusWidget();

#if QT_CONFIG(sizegrip)
    setSizeGripVisible(false);
#endif

    // Store old geometry and set restore size if not already set.
    if (!restoreSize.isValid()) {
        oldGeometry = q->geometry();
        restoreSize.setWidth(oldGeometry.width());
        restoreSize.setHeight(oldGeometry.height());
    }

    // Hide the window before we change the geometry to avoid multiple resize
    // events and wrong window state.
    const bool wasVisible = q->isVisible();
    if (wasVisible)
        q->setVisible(false);

    // Show the internal widget if it was hidden by us.
    if (baseWidget && isWidgetHiddenByUs) {
        baseWidget->show();
        isWidgetHiddenByUs = false;
    }

    updateGeometryConstraints();

    if (wasVisible) {
#if QT_CONFIG(menubar)
        if (QMenuBar *mBar = menuBar())
            showButtonsInMenuBar(mBar);
        else
#endif
        if (!controlContainer)
            controlContainer = new ControlContainer(q);
    }

    QWidget *parent = q->parentWidget();
    QRect availableRect = parent->contentsRect();

    // Adjust geometry if the sub-window is inside a scroll area.
    QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(parent->parentWidget());
    if (scrollArea && scrollArea->viewport() == parent) {
        QScrollBar *hbar = scrollArea->horizontalScrollBar();
        QScrollBar *vbar = scrollArea->verticalScrollBar();
        const int xOffset = hbar ? hbar->value() : 0;
        const int yOffset = vbar ? vbar->value() : 0;
        availableRect.adjust(-xOffset, -yOffset, -xOffset, -yOffset);
        oldGeometry.adjust(xOffset, yOffset, xOffset, yOffset);
    }

    setNewGeometry(&availableRect);
    // QWidget::setGeometry will reset Qt::WindowMaximized so we have to update it here.
    ensureWindowState(Qt::WindowMaximized);

    if (wasVisible)
        q->setVisible(true);

    resizeEnabled = false;
    moveEnabled = false;

#ifndef QT_NO_ACTION
    setEnabled(MoveAction, moveEnabled);
    setEnabled(MaximizeAction, false);
    setEnabled(MinimizeAction, true);
    setEnabled(RestoreAction, true);
    setEnabled(ResizeAction, resizeEnabled);
#endif // QT_NO_ACTION

    Q_ASSERT(q->windowState() & Qt::WindowMaximized);
    Q_ASSERT(!(q->windowState() & Qt::WindowMinimized));

    restoreFocus();
    updateMask();
}